

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
ipx::Model::CorrectScaledBasicSolution
          (Model *this,Vector *x,Vector *slack,Vector *y,Vector *z,
          vector<int,_std::allocator<int>_> *cbasis,vector<int,_std::allocator<int>_> *vbasis)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  double dVar10;
  
  iVar1 = this->num_var_;
  if (0 < (long)iVar1) {
    piVar3 = (vbasis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    pdVar4 = z->_M_data;
    pdVar5 = (this->scaled_lbuser_)._M_data;
    pdVar7 = (this->scaled_ubuser_)._M_data;
    pdVar6 = x->_M_data;
    lVar8 = 0;
    do {
      iVar2 = piVar3[lVar8];
      if (iVar2 == 0) {
        dVar10 = 0.0;
        pdVar9 = pdVar4;
LAB_003ac0a2:
        pdVar9[lVar8] = dVar10;
      }
      else {
        pdVar9 = pdVar5;
        if ((iVar2 == -1) || (pdVar9 = pdVar7, iVar2 == -2)) {
          dVar10 = pdVar9[lVar8];
          pdVar9 = pdVar6;
          goto LAB_003ac0a2;
        }
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  iVar1 = this->num_constr_;
  if (0 < (long)iVar1) {
    piVar3 = (cbasis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    pdVar4 = y->_M_data;
    pdVar5 = slack->_M_data;
    lVar8 = 0;
    do {
      iVar2 = piVar3[lVar8];
      pdVar7 = pdVar5;
      if ((iVar2 == -1) || (pdVar7 = pdVar4, iVar2 == 0)) {
        pdVar7[lVar8] = 0.0;
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  return;
}

Assistant:

void Model::CorrectScaledBasicSolution(Vector& x, Vector& slack, Vector& y,
                                       Vector& z,
                                       const std::vector<Int> cbasis,
                                       const std::vector<Int> vbasis) const {
    for (Int j = 0; j < num_var_; j++) {
        if (vbasis[j] == IPX_nonbasic_lb)
            x[j] = scaled_lbuser_[j];
        if (vbasis[j] == IPX_nonbasic_ub)
            x[j] = scaled_ubuser_[j];
        if (vbasis[j] == IPX_basic)
            z[j] = 0.0;
    }
    for (Int i = 0; i < num_constr_; i++) {
        if (cbasis[i] == IPX_nonbasic)
            slack[i] = 0.0;
        if (cbasis[i] == IPX_basic)
            y[i] = 0.0;
    }
}